

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

Status __thiscall
google::protobuf::json_internal::anon_unknown_5::
ParseListValue<google::protobuf::json_internal::ParseProto3Type>
          (anon_unknown_5 *this,JsonLexer *lex,
          Desc<google::protobuf::json_internal::ParseProto3Type> *desc,
          Msg<google::protobuf::json_internal::ParseProto3Type> *msg)

{
  pointer *ppCVar1;
  MessagePath *this_00;
  iterator __position;
  Msg<google::protobuf::json_internal::ParseProto3Type> *msg_00;
  Component local_58;
  
  msg_00 = (Msg<google::protobuf::json_internal::ParseProto3Type> *)
           Proto3Type::MustHaveField(desc,1);
  this_00 = lex->path_;
  local_58.type_name = Proto3Type::FieldTypeName((Field)msg_00);
  local_58.type = TYPE_MESSAGE;
  local_58.field_name._M_len = 6;
  local_58.field_name._M_str = "<list>";
  local_58.repeated_index = -1;
  __position._M_current =
       (this_00->components_).
       super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this_00->components_).
      super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
    ::_M_realloc_insert<google::protobuf::json_internal::MessagePath::Component>
              (&this_00->components_,__position,&local_58);
  }
  else {
    ((__position._M_current)->field_name)._M_str = "<list>";
    *(ulong *)&(__position._M_current)->repeated_index = CONCAT44(local_58._44_4_,0xffffffff);
    ((__position._M_current)->type_name)._M_str = local_58.type_name._M_str;
    ((__position._M_current)->field_name)._M_len = 6;
    *(ulong *)__position._M_current = CONCAT44(local_58._4_4_,0xb);
    ((__position._M_current)->type_name)._M_len = local_58.type_name._M_len;
    ppCVar1 = &(this_00->components_).
               super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  ParseProto3Type::RecordAsSeen((Field)msg_00,msg);
  ParseArray<google::protobuf::json_internal::ParseProto3Type>
            ((JsonLexer *)this,(Field<google::protobuf::json_internal::ParseProto3Type>)lex,msg_00);
  ppCVar1 = &(this_00->components_).
             super__Vector_base<google::protobuf::json_internal::MessagePath::Component,_std::allocator<google::protobuf::json_internal::MessagePath::Component>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppCVar1 = *ppCVar1 + -1;
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ParseListValue(JsonLexer& lex, const Desc<Traits>& desc,
                            Msg<Traits>& msg) {
  auto entry_field = Traits::MustHaveField(desc, 1);
  auto pop = lex.path().Push("<list>", FieldDescriptor::TYPE_MESSAGE,
                             Traits::FieldTypeName(entry_field));

  // ListValues are always cleared even if set to [].
  Traits::RecordAsSeen(entry_field, msg);
  // Parsing an array does the right thing: see the analogous comment in
  // ParseStructValue.
  return ParseArray<Traits>(lex, entry_field, msg);
}